

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_test_fixture.cpp
# Opt level: O1

void __thiscall
wallet::InitWalletDirTestingSetup::SetWalletDir
          (InitWalletDirTestingSetup *this,path *walletdir_path)

{
  pointer pcVar1;
  long in_FS_OFFSET;
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"-walletdir","");
  pcVar1 = (walletdir_path->super_path)._M_pathname._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,pcVar1,
             pcVar1 + (walletdir_path->super_path)._M_pathname._M_string_length);
  ArgsManager::ForceSetArg(&(this->super_BasicTestingSetup).m_args,&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void InitWalletDirTestingSetup::SetWalletDir(const fs::path& walletdir_path)
{
    m_args.ForceSetArg("-walletdir", fs::PathToString(walletdir_path));
}